

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)

{
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  char cVar2;
  int iVar3;
  bnode *__ptr;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_33;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0x801;
  __ptr->flag = 0;
  __ptr->level = 1;
  __ptr->nentry = 10;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 'd';
  uVar6 = 0;
  pcVar5 = (char *)(auStack_c0 + 3);
  do {
    pcVar4 = pcVar5;
    pcVar5 = pcVar4 + -0x10;
    auStack_c0[uVar6 + 3] = pcVar5;
    builtin_strncpy(pcVar4 + -0x18,"\x1d4\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    sprintf(pcVar5,"key%d",uVar6 & 0xffffffff);
    p_Var1 = kv_ops->set_kv;
    builtin_strncpy(pcVar4 + -0x18,".4\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)uVar6,pcVar5,local_31);
    local_31[0] = local_31[0] + '\x01';
    uVar6 = uVar6 + 1;
  } while (uVar6 != 10);
  local_31[0] = 'd';
  lVar7 = 0;
  do {
    p_Var1 = kv_ops->get_kv;
    builtin_strncpy(pcVar4 + -0x18,"X4\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)lVar7,&__test_begin.tv_usec,&local_32);
    pcVar5 = (char *)auStack_c0[lVar7 + 3];
    builtin_strncpy(pcVar4 + -0x18,"k4\x10",4);
    pcVar4[-0x14] = '\0';
    pcVar4[-0x13] = '\0';
    pcVar4[-0x12] = '\0';
    pcVar4[-0x11] = '\0';
    iVar3 = strcmp((char *)&__test_begin.tv_usec,pcVar5);
    if (iVar3 != 0) {
      pcVar4[-0x18] = -0x6e;
      pcVar4[-0x17] = '4';
      pcVar4[-0x16] = '\x10';
      pcVar4[-0x15] = '\0';
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_get_var_nentry_test();
    }
    cVar2 = local_32;
    if (local_32 != local_31[0]) {
      pcVar4[-0x18] = -0x5b;
      pcVar4[-0x17] = '4';
      pcVar4[-0x16] = '\x10';
      pcVar4[-0x15] = '\0';
      pcVar4[-0x14] = '\0';
      pcVar4[-0x13] = '\0';
      pcVar4[-0x12] = '\0';
      pcVar4[-0x11] = '\0';
      kv_get_var_nentry_test();
      cVar2 = local_33;
    }
    local_31[0] = cVar2 + '\x01';
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  pcVar4[-0x18] = -0x4e;
  pcVar4[-0x17] = '4';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  free(__ptr);
  pcVar4[-0x18] = -0x49;
  pcVar4[-0x17] = '4';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  memleak_end();
  pcVar5 = "%s PASSED\n";
  if (kv_get_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar5 = "%s FAILED\n";
  }
  pcVar4[-0x18] = -0x18;
  pcVar4[-0x17] = '4';
  pcVar4[-0x16] = '\x10';
  pcVar4[-0x15] = '\0';
  pcVar4[-0x14] = '\0';
  pcVar4[-0x13] = '\0';
  pcVar4[-0x12] = '\0';
  pcVar4[-0x11] = '\0';
  fprintf(_stderr,pcVar5,"kv_get_var_nentry_test");
  return;
}

Assistant:

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v, v_out;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // set n keys
    for (idx = 0; idx < n; idx ++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}